

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *
vkt::pipeline::anon_unknown_0::createSwizzledCopy<tcu::TextureCubeArrayView>
          (MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
           *__return_storage_ptr__,TextureCubeArrayView *texture,VkComponentMapping *swz)

{
  int iVar1;
  ConstPixelBufferAccess *pCVar2;
  TextureFormat *pTVar3;
  TextureCubeArray *pTVar4;
  PixelBufferAccess *dst;
  int local_3c;
  DefaultDeleter<tcu::TextureCubeArray> local_35;
  int levelNdx;
  TextureFormat local_2c;
  undefined1 local_21;
  VkComponentMapping *local_20;
  VkComponentMapping *swz_local;
  TextureCubeArrayView *texture_local;
  MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *copy;
  
  local_21 = 0;
  local_20 = swz;
  swz_local = (VkComponentMapping *)texture;
  texture_local = (TextureCubeArrayView *)__return_storage_ptr__;
  pCVar2 = tcu::TextureCubeArrayView::getLevel(texture,0);
  pTVar3 = tcu::ConstPixelBufferAccess::getFormat(pCVar2);
  _levelNdx = *pTVar3;
  local_2c = getSwizzleTargetFormat(_levelNdx);
  pCVar2 = tcu::TextureCubeArrayView::getLevel((TextureCubeArrayView *)swz_local,0);
  pTVar4 = createSkeletonClone<tcu::TextureCubeArrayView>(local_2c,pCVar2);
  de::DefaultDeleter<tcu::TextureCubeArray>::DefaultDeleter(&local_35);
  de::details::MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::MovePtr
            (__return_storage_ptr__,pTVar4);
  for (local_3c = 0;
      iVar1 = tcu::TextureCubeArrayView::getNumLevels((TextureCubeArrayView *)swz_local),
      local_3c < iVar1; local_3c = local_3c + 1) {
    pTVar4 = de::details::
             UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
             operator->(&__return_storage_ptr__->
                         super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                       );
    tcu::TextureCubeArray::allocLevel(pTVar4,local_3c);
    pCVar2 = tcu::TextureCubeArrayView::getLevel((TextureCubeArrayView *)swz_local,local_3c);
    pTVar4 = de::details::
             UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
             operator->(&__return_storage_ptr__->
                         super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                       );
    dst = tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,local_3c);
    swizzle(pCVar2,dst,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<typename TexViewTraits<TextureViewType>::TextureType> createSwizzledCopy (const TextureViewType& texture, const vk::VkComponentMapping& swz)
{
	MovePtr<typename TexViewTraits<TextureViewType>::TextureType>	copy	(createSkeletonClone<TextureViewType>(getSwizzleTargetFormat(texture.getLevel(0).getFormat()), texture.getLevel(0)));

	for (int levelNdx = 0; levelNdx < texture.getNumLevels(); ++levelNdx)
	{
		copy->allocLevel(levelNdx);
		swizzle(texture.getLevel(levelNdx), copy->getLevel(levelNdx), swz);
	}

	return copy;
}